

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O2

void __thiscall flow::diagnostics::Report::tokenError<>(Report *this,SourceLocation *sloc,string *f)

{
  size_t in_RCX;
  string_view format_str;
  string sStack_68;
  SourceLocation local_48;
  
  SourceLocation::SourceLocation(&local_48,sloc);
  format_str.size_ = in_RCX;
  format_str.data_ = (char *)f->_M_string_length;
  fmt::v5::format<>(&sStack_68,(v5 *)(f->_M_dataplus)._M_p,format_str);
  emplace_back(this,TokenError,&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void tokenError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TokenError, sloc, fmt::format(f, std::move(args)...));
  }